

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaK_setoneret(FuncState *fs,expdesc *e)

{
  expdesc *e_local;
  FuncState *fs_local;
  
  if (e->k == VCALL) {
    e->k = VNONRELOC;
    (e->u).s.info = fs->f->code[(e->u).s.info] >> 6 & 0xff;
  }
  else if (e->k == VVARARG) {
    fs->f->code[(e->u).s.info] = fs->f->code[(e->u).s.info] & 0x7fffff | 0x1000000;
    e->k = VRELOCABLE;
  }
  return;
}

Assistant:

static void luaK_setoneret(FuncState*fs,expdesc*e){
if(e->k==VCALL){
e->k=VNONRELOC;
e->u.s.info=GETARG_A(getcode(fs,e));
}
else if(e->k==VVARARG){
SETARG_B(getcode(fs,e),2);
e->k=VRELOCABLE;
}
}